

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string *name,string *relative_to,PlaceholderType placeholder_type
          ,ResolveMode resolve_mode,bool build_it)

{
  Symbol SVar1;
  
  SVar1 = LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode,build_it);
  if ((SVar1.type == NULL_SYMBOL) && (this->pool_->allow_unknown_ == true)) {
    SVar1 = DescriptorPool::NewPlaceholderWithMutexHeld(this->pool_,name,placeholder_type);
  }
  return SVar1;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const string& name, const string& relative_to,
    DescriptorPool::PlaceholderType placeholder_type, ResolveMode resolve_mode,
    bool build_it) {
  Symbol result =
      LookupSymbolNoPlaceholder(name, relative_to, resolve_mode, build_it);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = pool_->NewPlaceholderWithMutexHeld(name, placeholder_type);
  }
  return result;
}